

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_tc.c
# Opt level: O0

void olsrv2_tc_cleanup(void)

{
  list_entity *plVar1;
  list_entity *__tempptr_14;
  list_entity *__tempptr_13;
  list_entity *__tempptr_12;
  list_entity *__tempptr_11;
  list_entity *__tempptr_10;
  list_entity *__tempptr_9;
  list_entity *__tempptr_8;
  list_entity *__tempptr_7;
  list_entity *__tempptr_6;
  list_entity *__tempptr_5;
  list_entity *__tempptr_4;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  olsrv2_tc_attachment *ae_it;
  olsrv2_tc_attachment *a_end;
  olsrv2_tc_edge *e_it;
  olsrv2_tc_edge *edge;
  olsrv2_tc_node *n_it;
  olsrv2_tc_node *node;
  
  n_it = (olsrv2_tc_node *)(_tc_tree.list_head.next + -0x15);
  while( true ) {
    if ((n_it->_originator_node).list.prev == _tc_tree.list_head.prev) break;
    plVar1 = (n_it->_edges).list_head.next;
    e_it = (olsrv2_tc_edge *)(plVar1 + -3);
    plVar1 = plVar1->next;
    while( true ) {
      a_end = (olsrv2_tc_attachment *)(plVar1 + -3);
      if ((e_it->_node).list.prev == (n_it->_edges).list_head.prev) break;
      _remove_edge(e_it,false);
      e_it = (olsrv2_tc_edge *)a_end;
      plVar1 = plVar1->next;
    }
    plVar1 = (n_it->_attached_networks).list_head.next;
    ae_it = (olsrv2_tc_attachment *)&plVar1[-3].prev;
    plVar1 = plVar1->next;
    while( true ) {
      __tempptr = (list_entity *)&plVar1[-3].prev;
      if ((ae_it->_src_node).list.prev == (n_it->_attached_networks).list_head.prev) break;
      olsrv2_tc_endpoint_remove(ae_it);
      ae_it = (olsrv2_tc_attachment *)__tempptr;
      plVar1 = plVar1->next;
    }
    n_it = (olsrv2_tc_node *)((n_it->_originator_node).list.next + -0x15);
  }
  n_it = (olsrv2_tc_node *)(_tc_tree.list_head.next + -0x15);
  plVar1 = (_tc_tree.list_head.next)->next;
  while( true ) {
    edge = (olsrv2_tc_edge *)(plVar1 + -0x15);
    if ((n_it->_originator_node).list.prev == _tc_tree.list_head.prev) break;
    olsrv2_tc_node_remove(n_it);
    n_it = (olsrv2_tc_node *)edge;
    plVar1 = plVar1->next;
  }
  oonf_class_extension_remove(&_nhdp_neighbor_extension);
  oonf_class_remove(&_tc_endpoint_class);
  oonf_class_remove(&_tc_attached_class);
  oonf_class_remove(&_tc_edge_class);
  oonf_class_remove(&_tc_node_class);
  return;
}

Assistant:

void
olsrv2_tc_cleanup(void) {
  struct olsrv2_tc_node *node, *n_it;
  struct olsrv2_tc_edge *edge, *e_it;
  struct olsrv2_tc_attachment *a_end, *ae_it;

  avl_for_each_element(&_tc_tree, node, _originator_node) {
    avl_for_each_element_safe(&node->_edges, edge, _node, e_it) {
      /* remove edge without cleaning up the node */
      _remove_edge(edge, false);
    }

    avl_for_each_element_safe(&node->_attached_networks, a_end, _src_node, ae_it) {
      olsrv2_tc_endpoint_remove(a_end);
    }
  }

  avl_for_each_element_safe(&_tc_tree, node, _originator_node, n_it) {
    olsrv2_tc_node_remove(node);
  }

  oonf_class_extension_remove(&_nhdp_neighbor_extension);

  oonf_class_remove(&_tc_endpoint_class);
  oonf_class_remove(&_tc_attached_class);
  oonf_class_remove(&_tc_edge_class);
  oonf_class_remove(&_tc_node_class);
}